

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circularBuffer.c
# Opt level: O0

void setup_buffer(void)

{
  int iVar1;
  
  shmfd = shm_open("/your_student_id_SHM",0x42,0x180);
  if (shmfd == -1) {
    clean_buffer();
    fprintf(_stderr,"%s ERROR: error at opening shared memory\n",name);
    exit(1);
  }
  iVar1 = ftruncate(shmfd,0x160);
  if (iVar1 < 0) {
    clean_buffer();
    fprintf(_stderr,"%s ERROR: error at ftruncate\n",name);
    exit(1);
  }
  buf = (Buffer *)mmap((void *)0x0,0x160,3,1,shmfd,0);
  if (buf == (Buffer *)0xffffffffffffffff) {
    clean_buffer();
    fprintf(_stderr,"%s ERROR: mmap failed\n",name);
    exit(1);
  }
  free_sem = (sem_t *)sem_open("/your_student_id_sem_f",0xc0,0x180,5);
  used_sem = (sem_t *)sem_open("/your_student_id_sem_u",0xc0,0x180,0);
  write_sem = (sem_t *)sem_open("/your_student_id_sem_W",0xc0,0x180,1);
  if ((free_sem != (sem_t *)0x0) && (used_sem != (sem_t *)0x0)) {
    set_state(0);
    return;
  }
  clean_buffer();
  fprintf(_stderr,"%s ERROR: sem_open failed\n",name);
  exit(1);
}

Assistant:

void setup_buffer()
{
    shmfd = shm_open(SHMNAME, O_RDWR | O_CREAT, 0600);
    if (shmfd == -1)
    {
        clean_buffer();
        ERROR_EXIT("error at opening shared memory");
    }

    if (ftruncate(shmfd, sizeof(*buf)) < 0)
    {
        clean_buffer();
        ERROR_EXIT("error at ftruncate");
    }
    buf = mmap(NULL, sizeof(*buf), PROT_READ | PROT_WRITE, MAP_SHARED, shmfd, 0);
    if (buf == MAP_FAILED)
    {
        clean_buffer();
        ERROR_EXIT("mmap failed");
    }

    free_sem = sem_open(SEM_F, O_CREAT | O_EXCL, 0600, BUFFERLENGTH);
    used_sem = sem_open(SEM_U, O_CREAT | O_EXCL, 0600, 0);
    write_sem = sem_open(SEM_W, O_CREAT | O_EXCL, 0600, 1);

    if (free_sem == SEM_FAILED || used_sem == SEM_FAILED)
    {
        clean_buffer();
        ERROR_EXIT("sem_open failed");
    }
    set_state(0);
}